

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawLoader.h
# Opt level: O0

void __thiscall
Assimp::RAWImporter::MeshInformation::MeshInformation(MeshInformation *this,string *_name)

{
  string *_name_local;
  MeshInformation *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->vertices);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector(&this->colors);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&this->vertices,100);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(&this->colors,100);
  return;
}

Assistant:

explicit MeshInformation(const std::string& _name)
            : name(_name)
        {
            vertices.reserve(100);
            colors.reserve(100);
        }